

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::TextureBufferFormatCase::iterate(TextureBufferFormatCase *this)

{
  code *pcVar1;
  RenderContext *context;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  RGBA threshold_00;
  TestLog *log_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar7;
  undefined4 extraout_var_01;
  PixelFormat *pPVar8;
  TextureFormat *pTVar9;
  reference pvVar10;
  undefined4 extraout_var_02;
  undefined1 local_1b8 [7];
  bool isOk;
  PixelBufferAccess local_198;
  TextureFormat local_170;
  undefined1 local_168 [8];
  TextureFormatInfo spec;
  undefined1 local_100 [8];
  ConstPixelBufferAccess effectiveRefTexture;
  RenderParams renderParams;
  vector<float,_std::allocator<float>_> texCoord;
  RGBA threshold;
  undefined1 local_60 [8];
  Surface referenceFrame;
  Surface renderedFrame;
  RandomViewport viewport;
  Functions *gl;
  TestLog *log;
  TextureBufferFormatCase *this_local;
  long lVar6;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = this->m_width;
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(pcVar7);
  gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&renderedFrame.m_pixels.m_cap,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar3,1,dVar5);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)local_60,viewport.x,viewport.y);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar8 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar3));
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = tcu::PixelFormat::getColorThreshold(pPVar8);
  tcu::RGBA::RGBA((RGBA *)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,1,1,1,1);
  threshold_00 = tcu::operator+((RGBA *)((long)&texCoord.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4),
                                (RGBA *)&texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)(renderParams.colorBias.m_data + 2));
  glu::TextureTestUtil::RenderParams::RenderParams
            ((RenderParams *)((long)&effectiveRefTexture.m_data + 4),TEXTURETYPE_BUFFER);
  glu::getTextureBufferEffectiveRefTexture
            ((PixelBufferAccess *)(spec.lookupBias.m_data + 2),this->m_texture,
             this->m_maxTextureBufferSize);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_100,
             (ConstPixelBufferAccess *)(spec.lookupBias.m_data + 2));
  pTVar9 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_100);
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_168,pTVar9);
  renderParams.texType._0_1_ =
       (undefined1)renderParams.texType | (TEXTURETYPE_LAST|TEXTURETYPE_CUBE_ARRAY);
  pTVar9 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_100);
  local_170 = *pTVar9;
  glu::TextureTestUtil::getFetchSamplerType(local_170);
  renderParams.bias = spec.valueMax.m_data[2];
  renderParams.ref = spec.valueMax.m_data[3];
  renderParams.colorScale.m_data[0] = spec.lookupScale.m_data[0];
  renderParams.colorScale.m_data[1] = spec.lookupScale.m_data[1];
  renderParams.colorScale.m_data[2] = spec.lookupScale.m_data[2];
  renderParams.colorScale.m_data[3] = spec.lookupScale.m_data[3];
  renderParams.colorBias.m_data[0] = spec.lookupBias.m_data[0];
  renderParams.colorBias.m_data[1] = spec.lookupBias.m_data[1];
  iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_100);
  glu::TextureTestUtil::computeQuadTexCoord1D
            ((vector<float,_std::allocator<float>_> *)(renderParams.colorBias.m_data + 2),0.0,
             (float)iVar3);
  (**(code **)(lVar6 + 0x1c0))(0x3e000000,0x3e800000,0x3f000000,0x3f800000);
  (**(code **)(lVar6 + 0x188))(0x4500);
  (**(code **)(lVar6 + 0x188))(0x4500);
  (**(code **)(lVar6 + 0x1a00))
            ((int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,viewport.x,
             viewport.y);
  glu::TextureBuffer::upload(this->m_texture);
  (**(code **)(lVar6 + 8))(0x84c0);
  pcVar1 = *(code **)(lVar6 + 0xb8);
  dVar5 = glu::TextureBuffer::getGLTexture(this->m_texture);
  (*pcVar1)(0x8c2a,dVar5);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFormatTests.cpp"
                  ,0x167);
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)(renderParams.colorBias.m_data + 2),
                       0);
  gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,pvVar10,(RenderParams *)((long)&effectiveRefTexture.m_data + 4));
  context = this->m_renderCtx;
  tcu::Surface::getAccess(&local_198,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(context,(int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,
                  &local_198);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFormatTests.cpp"
                  ,0x16d);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar8 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar3));
  tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)local_1b8,(Surface *)local_60,pPVar8);
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)(renderParams.colorBias.m_data + 2),
                       0);
  glu::TextureTestUtil::fetchTexture
            ((SurfaceAccess *)local_1b8,(ConstPixelBufferAccess *)local_100,pvVar10,
             (Vec4 *)(spec.valueMax.m_data + 2),(Vec4 *)(spec.lookupScale.m_data + 2));
  bVar2 = glu::TextureTestUtil::compareImages
                    (log_00,(Surface *)local_60,(Surface *)&referenceFrame.m_pixels.m_cap,
                     threshold_00);
  pcVar7 = "Image comparison failed";
  if (bVar2) {
    pcVar7 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar2 & QP_TEST_RESULT_FAIL,pcVar7);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)(renderParams.colorBias.m_data + 2));
  tcu::Surface::~Surface((Surface *)local_60);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  return STOP;
}

Assistant:

TextureBufferFormatCase::IterateResult TextureBufferFormatCase::iterate (void)
{
	TestLog&							log						= m_testCtx.getLog();
	const glw::Functions&				gl						= m_renderCtx.getFunctions();
	RandomViewport						viewport				(m_renderCtx.getRenderTarget(), m_width, 1, deStringHash(getName()));
	tcu::Surface						renderedFrame			(viewport.width, viewport.height);
	tcu::Surface						referenceFrame			(viewport.width, viewport.height);
	tcu::RGBA							threshold				= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>						texCoord;
	RenderParams						renderParams			(TEXTURETYPE_BUFFER);
	const tcu::ConstPixelBufferAccess	effectiveRefTexture		= glu::getTextureBufferEffectiveRefTexture(*m_texture, m_maxTextureBufferSize);
	tcu::TextureFormatInfo				spec					= tcu::getTextureFormatInfo(effectiveRefTexture.getFormat());

	renderParams.flags			|= RenderParams::LOG_ALL;
	renderParams.samplerType	= getFetchSamplerType(effectiveRefTexture.getFormat());
	renderParams.colorScale		= spec.lookupScale;
	renderParams.colorBias		= spec.lookupBias;

	computeQuadTexCoord1D(texCoord, 0.0f, (float)(effectiveRefTexture.getWidth()));

	gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Setup base viewport.
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Upload texture data to GL.
	m_texture->upload();

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_BUFFER, m_texture->getGLTexture());

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");

	// Compute reference.
	fetchTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), effectiveRefTexture, &texCoord[0], spec.lookupScale, spec.lookupBias);

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}